

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_ru_u_row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,true,false>>>
               (void)

{
  allocator<unsigned_int> *this;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  bool bVar1;
  reference witness;
  uint local_3a4;
  reference local_3a0;
  Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>_>
  *entry;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  Row *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  undefined1 local_358 [4];
  uint i;
  column_content<typename_Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>::Column>
  orderedRows;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_310;
  allocator<unsigned_int> local_2f5;
  uint local_2f4 [3];
  iterator local_2e8;
  size_type local_2e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d8;
  allocator<unsigned_int> local_2bd;
  uint local_2bc;
  iterator local_2b8;
  size_type local_2b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2a8;
  allocator<unsigned_int> local_28d;
  uint local_28c;
  iterator local_288;
  size_type local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  allocator<unsigned_int> local_25d;
  uint local_25c;
  iterator local_258;
  size_type local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  allocator<unsigned_int> local_22d;
  uint local_22c;
  iterator local_228;
  size_type local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  allocator<unsigned_int> local_1fd;
  uint local_1fc;
  iterator local_1f8;
  size_type local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  undefined1 local_1d0 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  undefined1 local_1a8 [8];
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,true,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,true,false>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,true,false>>
              *)local_1a8,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.operators_,5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_1d0);
  local_1fc = 0;
  local_1f8 = &local_1fc;
  local_1f0 = 1;
  std::allocator<unsigned_int>::allocator(&local_1fd);
  __l_05._M_len = local_1f0;
  __l_05._M_array = local_1f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1e8,__l_05,&local_1fd);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_1d0,&local_1e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1e8);
  std::allocator<unsigned_int>::~allocator(&local_1fd);
  local_22c = 1;
  local_228 = &local_22c;
  local_220 = 1;
  std::allocator<unsigned_int>::allocator(&local_22d);
  __l_04._M_len = local_220;
  __l_04._M_array = local_228;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_218,__l_04,&local_22d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_1d0,&local_218);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_218);
  std::allocator<unsigned_int>::~allocator(&local_22d);
  local_25c = 2;
  local_258 = &local_25c;
  local_250 = 1;
  std::allocator<unsigned_int>::allocator(&local_25d);
  __l_03._M_len = local_250;
  __l_03._M_array = local_258;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_248,__l_03,&local_25d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_1d0,&local_248);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_248);
  std::allocator<unsigned_int>::~allocator(&local_25d);
  local_28c = 3;
  local_288 = &local_28c;
  local_280 = 1;
  std::allocator<unsigned_int>::allocator(&local_28d);
  __l_02._M_len = local_280;
  __l_02._M_array = local_288;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_278,__l_02,&local_28d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_1d0,&local_278);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_278);
  std::allocator<unsigned_int>::~allocator(&local_28d);
  local_2bc = 4;
  local_2b8 = &local_2bc;
  local_2b0 = 1;
  std::allocator<unsigned_int>::allocator(&local_2bd);
  __l_01._M_len = local_2b0;
  __l_01._M_array = local_2b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2a8,__l_01,&local_2bd);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_1d0,&local_2a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2a8);
  std::allocator<unsigned_int>::~allocator(&local_2bd);
  local_2f4[0] = 3;
  local_2f4[1] = 4;
  local_2f4[2] = 5;
  local_2e8 = local_2f4;
  local_2e0 = 3;
  std::allocator<unsigned_int>::allocator(&local_2f5);
  __l_00._M_len = local_2e0;
  __l_00._M_array = local_2e8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_2d8,__l_00,&local_2f5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_1d0,&local_2d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2d8);
  std::allocator<unsigned_int>::~allocator(&local_2f5);
  orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 6;
  this = (allocator<unsigned_int> *)
         ((long)&orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count + 3);
  std::allocator<unsigned_int>::allocator(this);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count + 4)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_310,__l,this);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_1d0,&local_310);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_310);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count + 3));
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_358)
  ;
  __range1._4_4_ = 0;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_1d0);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1d0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&r);
    if (!bVar1) break;
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               local_358);
    Gudhi::persistence_matrix::
    Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>
    ::get_row((Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>
               *)local_1a8,__range1._4_4_,false);
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
    ::begin((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
             *)&__end0_1);
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
    ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
           *)&entry);
    while( true ) {
      bVar1 = boost::intrusive::operator!=
                        (&__end0_1,
                         (list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>::Matrix_row_tag,_1U>,_true>
                          *)&entry);
      if (!bVar1) break;
      local_3a0 = boost::intrusive::
                  list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>::Matrix_row_tag,_1U>,_true>
                  ::operator*(&__end0_1);
      local_3a4 = Gudhi::persistence_matrix::Entry_column_index<unsigned_int>::get_column_index
                            (&local_3a0->super_Entry_column_index_option);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_358,&local_3a4);
      boost::intrusive::
      list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>::Matrix_row_tag,_1U>,_true>
      ::operator++(&__end0_1);
    }
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,true,false>>>>
              (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>_>_>
                        *)local_358);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_358)
  ;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1d0);
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>
  ::~Matrix((Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true,_true,_false>_>
             *)local_1a8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.operators_);
  return;
}

Assistant:

void test_ru_u_row_access() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<witness_content<typename Matrix::Column> > rows;
  if constexpr (Matrix::Option_list::is_z2) {
    rows.push_back({0});
    rows.push_back({1});
    rows.push_back({2});
    rows.push_back({3});
    rows.push_back({4});
    rows.push_back({3, 4, 5});
    rows.push_back({6});
  } else {
    rows.push_back({{0, 1}});
    rows.push_back({{1, 1}});
    rows.push_back({{2, 1}});
    rows.push_back({{3, 1}, {5, 4}});
    rows.push_back({{4, 1}, {5, 4}});
    rows.push_back({{5, 1}});
    rows.push_back({{6, 1}});
  }

  column_content<typename Matrix::Column> orderedRows;
  unsigned int i = 0;
  for (auto& r : rows) {
    orderedRows.clear();
    for (const auto& entry : m.get_row(i++, false)) {
      if constexpr (Matrix::Option_list::is_z2) {
        orderedRows.insert(entry.get_column_index());
      } else {
        orderedRows.insert({entry.get_column_index(), entry.get_element()});
      }
    }
    test_column_equality<typename Matrix::Column>(r, orderedRows);
  }
}